

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O2

void __thiscall
efsw::FileWatcherInotify::handleAction
          (FileWatcherInotify *this,Watcher *watch,string *filename,unsigned_long action,
          string oldFilename)

{
  string *__rhs;
  WatchID WVar1;
  FileWatchListener *pFVar2;
  _Base_ptr p_Var3;
  Uint64 UVar4;
  __type _Var5;
  bool bVar6;
  _Base_ptr p_Var7;
  string *fpath_00;
  string *psVar8;
  _Self __tmp;
  _Self __tmp_1;
  string fpath;
  string opath;
  FileInfo local_178;
  string local_130 [32];
  string local_110;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90;
  string local_70;
  string local_50;
  
  if (watch == (Watcher *)0x0) {
    return;
  }
  if (watch->Listener == (FileWatchListener *)0x0) {
    return;
  }
  psVar8 = &watch->Directory;
  std::operator+(&fpath,psVar8,filename);
  if ((action & 10) == 0) {
    if ((char)action < '\0') {
      __rhs = &watch->OldFileName;
      WVar1 = watch->ID;
      pFVar2 = watch->Listener;
      if ((watch->OldFileName)._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_b0,"",(allocator<char> *)&local_178);
        (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,psVar8,filename,1,local_b0);
        std::__cxx11::string::~string(local_b0);
        WVar1 = watch->ID;
        pFVar2 = watch->Listener;
        std::__cxx11::string::string<std::allocator<char>>
                  (local_d0,"",(allocator<char> *)&local_178);
        (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,psVar8,filename,3,local_d0);
        std::__cxx11::string::~string(local_d0);
        fpath_00 = &local_50;
        std::__cxx11::string::string((string *)fpath_00,(string *)&fpath);
        checkForNewWatcher(this,watch,fpath_00);
      }
      else {
        fpath_00 = &local_70;
        std::__cxx11::string::string((string *)fpath_00,(string *)__rhs);
        (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,psVar8,filename,4,fpath_00);
      }
      std::__cxx11::string::~string((string *)fpath_00);
      if ((watch->Recursive == true) && (bVar6 = FileSystem::isDirectory(&fpath), bVar6)) {
        std::operator+(&opath,psVar8,__rhs);
        FileSystem::dirAddSlashAtEnd(&opath);
        FileSystem::dirAddSlashAtEnd(&fpath);
        for (p_Var7 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&(p_Var7[1]._M_parent)->_M_left,&opath);
          if (_Var5) {
            p_Var3 = p_Var7[1]._M_parent[5]._M_parent;
            FileInfo::FileInfo(&local_178,&opath);
            UVar4 = local_178.Inode;
            std::__cxx11::string::~string((string *)&local_178);
            if (p_Var3 == (_Base_ptr)UVar4) {
              std::__cxx11::string::_M_assign((string *)&(p_Var7[1]._M_parent)->_M_left);
              FileInfo::FileInfo(&local_178,&fpath);
              FileInfo::operator=((FileInfo *)&p_Var7[1]._M_parent[3]._M_parent,&local_178);
              std::__cxx11::string::~string((string *)&local_178);
              break;
            }
          }
        }
        std::__cxx11::string::~string((string *)&opath);
      }
      std::__cxx11::string::assign((char *)__rhs);
      goto LAB_0011f276;
    }
    if (((uint)action >> 8 & 1) == 0) {
      if ((action & 0x40) == 0) {
        if (((uint)action >> 9 & 1) != 0) {
          WVar1 = watch->ID;
          pFVar2 = watch->Listener;
          std::__cxx11::string::string<std::allocator<char>>
                    (local_130,"",(allocator<char> *)&local_178);
          (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,psVar8,filename,2,local_130);
          std::__cxx11::string::~string(local_130);
          FileSystem::dirAddSlashAtEnd(&fpath);
          if (watch->Recursive == true) {
            for (p_Var7 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var7 != &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
                p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
              _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&(p_Var7[1]._M_parent)->_M_left,&fpath);
              if (_Var5) {
                (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[4])
                          (this,(p_Var7[1]._M_parent)->_M_parent);
                break;
              }
            }
          }
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&watch->OldFileName);
      }
      goto LAB_0011f276;
    }
    WVar1 = watch->ID;
    pFVar2 = watch->Listener;
    std::__cxx11::string::string<std::allocator<char>>(local_f0,"",(allocator<char> *)&local_178);
    (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,psVar8,filename,1,local_f0);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::string((string *)&local_110,(string *)&fpath);
    checkForNewWatcher(this,watch,&local_110);
    psVar8 = &local_110;
  }
  else {
    WVar1 = watch->ID;
    pFVar2 = watch->Listener;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"",(allocator<char> *)&local_178);
    (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,psVar8,filename,3,&local_90);
    psVar8 = &local_90;
  }
  std::__cxx11::string::~string((string *)psVar8);
LAB_0011f276:
  std::__cxx11::string::~string((string *)&fpath);
  return;
}

Assistant:

void FileWatcherInotify::handleAction( Watcher* watch, const std::string& filename, unsigned long action, std::string oldFilename )
{
	if ( !watch || !watch->Listener )
	{
		return;
	}

	std::string fpath( watch->Directory + filename );

	if ( ( IN_CLOSE_WRITE & action ) || ( IN_MODIFY & action ) )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Modified );
	}
	else if( IN_MOVED_TO & action )
	{
		/// If OldFileName doesn't exist means that the file has been moved from other folder, so we just send the Add event
		if ( watch->OldFileName.empty() )
		{
			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Add );

			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Modified );

			checkForNewWatcher( watch, fpath );
		}
		else
		{
			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Moved, watch->OldFileName );
		}

		if ( watch->Recursive && FileSystem::isDirectory( fpath ) )
		{
			/// Update the new directory path
			std::string opath( watch->Directory + watch->OldFileName );
			FileSystem::dirAddSlashAtEnd( opath );
			FileSystem::dirAddSlashAtEnd( fpath );

			for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); it++ )
			{
				if ( it->second->Directory == opath && it->second->DirInfo.Inode == FileInfo( opath ).Inode )
				{
					it->second->Directory	= fpath;
					it->second->DirInfo		= FileInfo( fpath );

					break;
				}
			}
		}

		watch->OldFileName = "";
	}
	else if( IN_CREATE & action )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Add );

		checkForNewWatcher( watch, fpath );
	}
	else if ( IN_MOVED_FROM & action )
	{
		watch->OldFileName = filename;
	}
	else if( IN_DELETE & action )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Delete );

		FileSystem::dirAddSlashAtEnd( fpath );

		/// If the file erased is a directory and recursive is enabled, removes the directory erased
		if ( watch->Recursive )
		{
			for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); it++ )
			{
				if ( it->second->Directory == fpath )
				{
					removeWatch( it->second->ID );
					break;
				}
			}
		}
	}
}